

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::initBasicIndex(HModel *this)

{
  pointer piVar1;
  pointer piVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = this->numTot;
  if (0 < iVar4) {
    piVar1 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = 0;
    iVar5 = 0;
    do {
      if (piVar2[lVar3] == 0) {
        piVar1[iVar5] = (int)lVar3;
        iVar5 = iVar5 + 1;
        iVar4 = this->numTot;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar4);
  }
  return;
}

Assistant:

void HModel::initBasicIndex() {
  int numBasic = 0;
  for (int var = 0; var < numTot; var++) {
    if (!nonbasicFlag[var]) {
      assert(numBasic<numRow);
      basicIndex[numBasic] = var;
      numBasic++;
    }
  }
  assert(numBasic=numRow-1);
}